

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void output_bitmap(gen_ctx_t gen_ctx,char *head,bitmap_t bm,int print_name_p,MIR_reg_t *reg_map)

{
  MIR_context_t ctx_00;
  FILE *__stream;
  int iVar1;
  MIR_type_t tp;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_58 [8];
  bitmap_iterator_t bi;
  size_t nel;
  MIR_reg_t reg;
  MIR_context_t ctx;
  MIR_reg_t *reg_map_local;
  int print_name_p_local;
  bitmap_t bm_local;
  char *head_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  if ((bm != (bitmap_t)0x0) && (iVar1 = bitmap_empty_p(bm), iVar1 == 0)) {
    fprintf((FILE *)gen_ctx->debug_file,"%s",head);
    bitmap_iterator_init((bitmap_iterator_t *)local_58,bm);
    while (iVar1 = bitmap_iterator_next((bitmap_iterator_t *)local_58,&bi.nbit), iVar1 != 0) {
      fprintf((FILE *)gen_ctx->debug_file," %3lu",bi.nbit);
      if ((print_name_p != 0) && ((reg_map != (MIR_reg_t *)0x0 || (0x21 < bi.nbit)))) {
        nel._4_4_ = (MIR_reg_t)bi.nbit;
        if (reg_map != (MIR_reg_t *)0x0) {
          nel._4_4_ = reg_map[bi.nbit];
        }
        if (nel._4_4_ < 0x21) {
          __assert_fail("reg >= ST1_HARD_REG",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x535,
                        "void output_bitmap(gen_ctx_t, const char *, bitmap_t, int, MIR_reg_t *)");
        }
        __stream = (FILE *)gen_ctx->debug_file;
        tp = MIR_reg_type(ctx_00,nel._4_4_ - 0x21,(gen_ctx->curr_func_item->u).func);
        pcVar2 = MIR_type_str(ctx_00,tp);
        pcVar3 = MIR_reg_name(ctx_00,nel._4_4_ - 0x21,(gen_ctx->curr_func_item->u).func);
        fprintf(__stream,"(%s:%s)",pcVar2,pcVar3);
      }
    }
    fprintf((FILE *)gen_ctx->debug_file,"\n");
  }
  return;
}

Assistant:

static void output_bitmap (gen_ctx_t gen_ctx, const char *head, bitmap_t bm, int print_name_p,
                           MIR_reg_t *reg_map) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t reg;
  size_t nel;
  bitmap_iterator_t bi;

  if (bm == NULL || bitmap_empty_p (bm)) return;
  fprintf (debug_file, "%s", head);
  FOREACH_BITMAP_BIT (bi, bm, nel) {
    fprintf (debug_file, " %3lu", (unsigned long) nel);
    if (print_name_p && (reg_map != NULL || nel > MAX_HARD_REG)) {
      reg = (MIR_reg_t) nel;
      if (reg_map != NULL) reg = reg_map[nel];
      gen_assert (reg >= MAX_HARD_REG);
      fprintf (debug_file, "(%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func)),
               MIR_reg_name (ctx, reg - MAX_HARD_REG, curr_func_item->u.func));
    }
  }
  fprintf (debug_file, "\n");
}